

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O3

void dgrminer::fail_with_message(string *message,int line_number)

{
  undefined8 *puVar1;
  pointer pcVar2;
  uint uVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 extraout_RAX;
  uint uVar6;
  size_type *psVar7;
  ulong uVar8;
  uint __val;
  uint __len;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  string local_48;
  
  pcVar2 = (message->_M_dataplus)._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + message->_M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  __val = -line_number;
  if (0 < line_number) {
    __val = line_number;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar8;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0015544c;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0015544c;
      }
      if (uVar6 < 10000) goto LAB_0015544c;
      uVar8 = uVar8 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_0015544c:
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,(char)__len - (char)(line_number >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)line_number >> 0x1f) + (long)local_88),__len,__val);
  uVar8 = 0xf;
  if (local_68 != local_58) {
    uVar8 = local_58[0];
  }
  if (uVar8 < (ulong)(local_80 + local_60)) {
    uVar8 = 0xf;
    if (local_88 != local_78) {
      uVar8 = local_78[0];
    }
    if ((ulong)(local_80 + local_60) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
      goto LAB_001554d7;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
LAB_001554d7:
  local_a8 = (undefined8 *)*puVar4;
  puVar1 = puVar4 + 2;
  if (local_a8 == puVar1) {
    local_98 = *puVar1;
    uStack_90 = puVar4[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar1;
  }
  local_a0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
  local_48._M_dataplus._M_p = (pointer)*plVar5;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_48._M_dataplus._M_p == psVar7) {
    local_48.field_2._M_allocated_capacity = *psVar7;
    local_48.field_2._8_8_ = plVar5[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar7;
  }
  local_48._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  fail_with_message(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void fail_with_message(std::string message, int line_number)
    {
        fail_with_message(message + " (LINE " + std::to_string(line_number) + ")");
    }